

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

void __thiscall trento::Deuteron::Deuteron(Deuteron *this,double a,double b)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pNVar4;
  undefined8 in_XMM1_Qb;
  undefined1 auVar5 [16];
  
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_001329a0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4 = (pointer)operator_new(0x70);
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_start = pNVar4;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar4;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pNVar4 + 2;
  pNVar4->x_ = 0.0;
  pNVar4->y_ = 0.0;
  pNVar4->z_ = 0.0;
  pNVar4->is_participant_ = false;
  pNVar4->constituents_exist_ = false;
  *(undefined6 *)&pNVar4->field_0x1a = 0;
  (pNVar4->constituents_).
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar4->constituents_).
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar4->constituents_).
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4[1].x_ = 0.0;
  (pNVar4->constituents_).
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4[1].x_ = 0.0;
  pNVar4[1].y_ = 0.0;
  pNVar4[1].z_ = 0.0;
  pNVar4[1].is_participant_ = false;
  pNVar4[1].constituents_exist_ = false;
  *(undefined6 *)&pNVar4[1].field_0x1a = 0;
  pNVar4[1].constituents_.
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar4[1].constituents_.
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar4[1].constituents_.
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar4 + 2;
  (this->super_Nucleus).offset_ = 0.0;
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_00132a00;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = b;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = a;
  auVar2 = vminsd_avx(auVar3,auVar5);
  bVar1 = NAN(a);
  this->a_ = (double)((ulong)bVar1 * (long)b + (ulong)!bVar1 * auVar2._0_8_);
  auVar2 = vmaxsd_avx(auVar3,auVar5);
  this->b_ = (double)((ulong)bVar1 * (long)b + (ulong)!bVar1 * auVar2._0_8_);
  return;
}

Assistant:

Deuteron::Deuteron(double a, double b)
    : Nucleus(2),
      a_(std::fmin(a, b)),
      b_(std::fmax(a, b))
{}